

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepTiledInputFile.cpp
# Opt level: O0

void Imf_2_5::anon_unknown_8::readTileData
               (InputStreamMutex *streamData,Data *ifd,int dx,int dy,int lx,int ly,char **buffer,
               Int64 *dataSize,Int64 *unpackedDataSize)

{
  bool bVar1;
  int iVar2;
  Int64 *pIVar3;
  ostream *poVar4;
  InputExc *pIVar5;
  Int64 IVar6;
  ArgExc *this;
  ulong uVar7;
  void *pvVar8;
  long lVar9;
  int in_ECX;
  int in_EDX;
  long in_RSI;
  long in_RDI;
  int in_R8D;
  int in_R9D;
  IStream *unaff_retaddr;
  long *in_stack_00000008;
  ulong *in_stack_00000010;
  Int64 tableSize;
  stringstream _iex_throw_s_1;
  int partNumber;
  int levelY;
  int levelX;
  int tileYCoord;
  int tileXCoord;
  stringstream _iex_throw_s;
  Int64 tileOffset;
  unsigned_long *in_stack_fffffffffffffbf8;
  IStream *in_stack_fffffffffffffc00;
  undefined8 in_stack_fffffffffffffc08;
  undefined8 in_stack_fffffffffffffc10;
  TileOffsets *in_stack_fffffffffffffc18;
  long local_360;
  stringstream local_358 [16];
  ostream local_348 [376];
  int local_1d0;
  int local_1cc;
  int local_1c8;
  int local_1c4;
  int local_1c0;
  stringstream local_1b0 [16];
  ostream local_1a0 [376];
  Int64 local_28;
  int local_20;
  int local_1c;
  int local_18;
  int local_14;
  long local_10;
  
  local_20 = in_R9D;
  local_1c = in_R8D;
  local_18 = in_ECX;
  local_14 = in_EDX;
  local_10 = in_RSI;
  pIVar3 = TileOffsets::operator()
                     (in_stack_fffffffffffffc18,(int)((ulong)in_stack_fffffffffffffc10 >> 0x20),
                      (int)in_stack_fffffffffffffc10,(int)((ulong)in_stack_fffffffffffffc08 >> 0x20)
                      ,(int)in_stack_fffffffffffffc08);
  local_28 = *pIVar3;
  if (local_28 == 0) {
    iex_debugTrap();
    std::__cxx11::stringstream::stringstream(local_1b0);
    poVar4 = std::operator<<(local_1a0,"Tile (");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_14);
    poVar4 = std::operator<<(poVar4,", ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_18);
    poVar4 = std::operator<<(poVar4,", ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_1c);
    poVar4 = std::operator<<(poVar4,", ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_20);
    std::operator<<(poVar4,") is missing.");
    pIVar5 = (InputExc *)__cxa_allocate_exception(0x48);
    Iex_2_5::InputExc::InputExc(pIVar5,local_1b0);
    __cxa_throw(pIVar5,&Iex_2_5::InputExc::typeinfo,Iex_2_5::InputExc::~InputExc);
  }
  bVar1 = isMultiPart(*(int *)(local_10 + 0x70));
  if (bVar1) {
    IVar6 = (**(code **)(**(long **)(in_RDI + 0x28) + 0x28))();
    if (IVar6 != local_28) {
      (**(code **)(**(long **)(in_RDI + 0x28) + 0x30))(*(long **)(in_RDI + 0x28),local_28);
    }
  }
  else if (*(Int64 *)(in_RDI + 0x30) != local_28) {
    (**(code **)(**(long **)(in_RDI + 0x28) + 0x30))(*(long **)(in_RDI + 0x28),local_28);
  }
  bVar1 = isMultiPart(*(int *)(local_10 + 0x70));
  if ((bVar1) &&
     (Xdr::read<Imf_2_5::StreamIO,Imf_2_5::IStream>
                (in_stack_fffffffffffffc00,(int *)in_stack_fffffffffffffbf8),
     local_1d0 != *(int *)(local_10 + 0x158))) {
    iex_debugTrap();
    std::__cxx11::stringstream::stringstream(local_358);
    poVar4 = std::operator<<(local_348,"Unexpected part number ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_1d0);
    poVar4 = std::operator<<(poVar4,", should be ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,*(int *)(local_10 + 0x158));
    std::operator<<(poVar4,".");
    this = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_2_5::ArgExc::ArgExc(this,local_358);
    __cxa_throw(this,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
  }
  Xdr::read<Imf_2_5::StreamIO,Imf_2_5::IStream>
            (in_stack_fffffffffffffc00,(int *)in_stack_fffffffffffffbf8);
  Xdr::read<Imf_2_5::StreamIO,Imf_2_5::IStream>
            (in_stack_fffffffffffffc00,(int *)in_stack_fffffffffffffbf8);
  Xdr::read<Imf_2_5::StreamIO,Imf_2_5::IStream>
            (in_stack_fffffffffffffc00,(int *)in_stack_fffffffffffffbf8);
  Xdr::read<Imf_2_5::StreamIO,Imf_2_5::IStream>
            (in_stack_fffffffffffffc00,(int *)in_stack_fffffffffffffbf8);
  Xdr::read<Imf_2_5::StreamIO,Imf_2_5::IStream>(in_stack_fffffffffffffc00,in_stack_fffffffffffffbf8)
  ;
  Xdr::read<Imf_2_5::StreamIO,Imf_2_5::IStream>(in_stack_fffffffffffffc00,in_stack_fffffffffffffbf8)
  ;
  Xdr::read<Imf_2_5::StreamIO,Imf_2_5::IStream>(in_stack_fffffffffffffc00,in_stack_fffffffffffffbf8)
  ;
  Xdr::skip<Imf_2_5::StreamIO,Imf_2_5::IStream>(unaff_retaddr,(int)((ulong)in_RDI >> 0x20));
  if (local_1c0 != local_14) {
    pIVar5 = (InputExc *)__cxa_allocate_exception(0x48);
    Iex_2_5::InputExc::InputExc(pIVar5,"Unexpected tile x coordinate.");
    __cxa_throw(pIVar5,&Iex_2_5::InputExc::typeinfo,Iex_2_5::InputExc::~InputExc);
  }
  if (local_1c4 == local_18) {
    if (local_1c8 != local_1c) {
      pIVar5 = (InputExc *)__cxa_allocate_exception(0x48);
      Iex_2_5::InputExc::InputExc(pIVar5,"Unexpected tile x level number coordinate.");
      __cxa_throw(pIVar5,&Iex_2_5::InputExc::typeinfo,Iex_2_5::InputExc::~InputExc);
    }
    if (local_1cc == local_20) {
      uVar7 = (**(code **)(**(long **)(in_RDI + 0x28) + 0x10))();
      if ((uVar7 & 1) == 0) {
        if ((*in_stack_00000008 != 0) && ((void *)*in_stack_00000008 != (void *)0x0)) {
          operator_delete__((void *)*in_stack_00000008);
        }
        pvVar8 = operator_new__(*in_stack_00000010);
        *in_stack_00000008 = (long)pvVar8;
        (**(code **)(**(long **)(in_RDI + 0x28) + 0x18))
                  (*(long **)(in_RDI + 0x28),*in_stack_00000008,*in_stack_00000010 & 0xffffffff);
      }
      else {
        lVar9 = (**(code **)(**(long **)(in_RDI + 0x28) + 0x20))
                          (*(long **)(in_RDI + 0x28),*in_stack_00000010 & 0xffffffff);
        *in_stack_00000008 = lVar9;
      }
      IVar6 = local_28;
      iVar2 = Xdr::size<int>();
      lVar9 = IVar6 + (long)(iVar2 << 2);
      iVar2 = Xdr::size<unsigned_long>();
      *(ulong *)(in_RDI + 0x30) = lVar9 + iVar2 * 3 + local_360 + *in_stack_00000010;
      return;
    }
    pIVar5 = (InputExc *)__cxa_allocate_exception(0x48);
    Iex_2_5::InputExc::InputExc(pIVar5,"Unexpected tile y level number coordinate.");
    __cxa_throw(pIVar5,&Iex_2_5::InputExc::typeinfo,Iex_2_5::InputExc::~InputExc);
  }
  pIVar5 = (InputExc *)__cxa_allocate_exception(0x48);
  Iex_2_5::InputExc::InputExc(pIVar5,"Unexpected tile y coordinate.");
  __cxa_throw(pIVar5,&Iex_2_5::InputExc::typeinfo,Iex_2_5::InputExc::~InputExc);
}

Assistant:

void
readTileData (InputStreamMutex *streamData,
              DeepTiledInputFile::Data *ifd,
              int dx, int dy,
              int lx, int ly,
              char *&buffer,
              Int64 &dataSize,
              Int64 &unpackedDataSize)
{
    //
    // Read a single tile block from the file and into the array pointed
    // to by buffer.  If the file is memory-mapped, then we change where
    // buffer points instead of writing into the array (hence buffer needs
    // to be a reference to a char *).
    //

    //
    // Look up the location for this tile in the Index and
    // seek to that position if necessary
    //

    Int64 tileOffset = ifd->tileOffsets (dx, dy, lx, ly);

    if (tileOffset == 0)
    {
        THROW (IEX_NAMESPACE::InputExc, "Tile (" << dx << ", " << dy << ", " <<
                              lx << ", " << ly << ") is missing.");
    }

    //
    // In a multi-part file, the next chunk does not need to
    // belong to the same part, so we have to compare the
    // offset here.
    //

    if ( !isMultiPart(ifd->version) )
    {
        if (streamData->currentPosition != tileOffset)
            streamData->is->seekg(tileOffset);
    }
    else
    {
        //
        // In a multi-part file, the file pointer may be moved by other
        // parts, so we have to ask tellg() where we are.
        //
        if (streamData->is->tellg() != tileOffset)
            streamData->is->seekg (tileOffset);
    }

    //
    // Read the first few bytes of the tile (the header).
    // Verify that the tile coordinates and the level number
    // are correct.
    //

    int tileXCoord, tileYCoord, levelX, levelY;

    if (isMultiPart(ifd->version))
    {
        int partNumber;
        Xdr::read <StreamIO> (*streamData->is, partNumber);
        if (partNumber != ifd->partNumber)
        {
            THROW (IEX_NAMESPACE::ArgExc, "Unexpected part number " << partNumber
                   << ", should be " << ifd->partNumber << ".");
        }
    }

    Xdr::read <StreamIO> (*streamData->is, tileXCoord);
    Xdr::read <StreamIO> (*streamData->is, tileYCoord);
    Xdr::read <StreamIO> (*streamData->is, levelX);
    Xdr::read <StreamIO> (*streamData->is, levelY);

    Int64 tableSize;
    Xdr::read <StreamIO> (*streamData->is, tableSize);

    Xdr::read <StreamIO> (*streamData->is, dataSize);
    Xdr::read <StreamIO> (*streamData->is, unpackedDataSize);


    //
    // Skip the pixel sample count table because we have read this data.
    //

    Xdr::skip <StreamIO> (*streamData->is, tableSize);


    if (tileXCoord != dx)
        throw IEX_NAMESPACE::InputExc ("Unexpected tile x coordinate.");

    if (tileYCoord != dy)
        throw IEX_NAMESPACE::InputExc ("Unexpected tile y coordinate.");

    if (levelX != lx)
        throw IEX_NAMESPACE::InputExc ("Unexpected tile x level number coordinate.");

    if (levelY != ly)
        throw IEX_NAMESPACE::InputExc ("Unexpected tile y level number coordinate.");

    //
    // Read the pixel data.
    //

    if (streamData->is->isMemoryMapped ())
        buffer = streamData->is->readMemoryMapped (dataSize);
    else
    {
        // (TODO) check if the packed data size is too big?
        // (TODO) better memory management here. Don't delete buffer everytime.
        if (buffer != 0) delete[] buffer;
        buffer = new char[dataSize];
        streamData->is->read (buffer, dataSize);
    }

    //
    // Keep track of which tile is the next one in
    // the file, so that we can avoid redundant seekg()
    // operations (seekg() can be fairly expensive).
    //

    streamData->currentPosition = tileOffset + 4 * Xdr::size<int>() +
                                  3 * Xdr::size<Int64>()            +
                                  tableSize                         +
                                  dataSize;
}